

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.c
# Opt level: O0

void qcc_engine_run_test(qcc_engine *eng,char *name,qcc_test_fn test_fn)

{
  qcc_test_result qVar1;
  uint local_28;
  uint local_24;
  uint i;
  uint successes;
  qcc_test_fn test_fn_local;
  char *name_local;
  qcc_engine *eng_local;
  
  local_24 = 0;
  for (local_28 = 0; local_28 != eng->max_tries; local_28 = local_28 + 1) {
    qVar1 = _run_test_and_shrink(eng,name,test_fn);
    if (qVar1 == QCC_TEST_SUCCEED) {
      local_24 = local_24 + 1;
    }
    else if (qVar1 == QCC_TEST_FAIL) {
      return;
    }
    if (local_24 == eng->required_successes) break;
  }
  if (local_24 == 0) {
    qcc_engine_failure(eng);
    qcc_logger_printf(&eng->logger,"%s: ABORTED\n",name);
    qcc_logger_printf(&eng->logger,"    No input was accepted by test as valid\n");
  }
  else {
    eng->total_tests = eng->total_tests + 1;
    if (local_24 < eng->required_successes) {
      qcc_logger_printf(&eng->logger,"%s:\n",name);
      qcc_logger_printf(&eng->logger,"    Warning: Only %u successful runs out of %u were made\n",
                        (ulong)local_24,(ulong)eng->required_successes);
    }
  }
  return;
}

Assistant:

void qcc_engine_run_test(struct qcc_engine *eng, const char *name,
                         qcc_test_fn test_fn)
{
    unsigned successes = 0;
    for (unsigned i = 0; i != eng->max_tries; ++i)
    {
        switch (_run_test_and_shrink(eng, name, test_fn))
        {
        case QCC_TEST_SUCCEED:
            ++successes;
            break;
        case QCC_TEST_FAIL:
            return;
        case QCC_TEST_SKIP:
        case QCC_TEST_OVERRUN:
            break;
        }

        if (successes == eng->required_successes) break;
    }

    if (successes == 0)
    {
        qcc_engine_failure(eng);
        qcc_logger_printf(&eng->logger, "%s: ABORTED\n", name);
        qcc_logger_printf(&eng->logger,
                          "    No input was accepted by test as valid\n");
        return;
    }

    ++eng->total_tests;
    if (successes < eng->required_successes)
    {
        qcc_logger_printf(&eng->logger, "%s:\n", name);
        qcc_logger_printf(
            &eng->logger,
            "    Warning: Only %u successful runs out of %u were made\n",
            successes, eng->required_successes);
    }
}